

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_dec.c
# Opt level: O0

void VP8ParseProba(VP8BitReader *br,VP8Decoder *dec)

{
  int iVar1;
  uint32_t uVar2;
  long in_RSI;
  int v;
  int p;
  int c;
  int b;
  int t;
  VP8Proba *proba;
  int in_stack_ffffffffffffffcc;
  uint32_t in_stack_ffffffffffffffd0;
  uint32_t in_stack_ffffffffffffffd4;
  int local_28;
  int prob;
  int iVar3;
  int iVar4;
  
  for (iVar4 = 0; iVar4 < 4; iVar4 = iVar4 + 1) {
    for (iVar3 = 0; iVar3 < 8; iVar3 = iVar3 + 1) {
      for (prob = 0; prob < 3; prob = prob + 1) {
        for (local_28 = 0; local_28 < 0xb; local_28 = local_28 + 1) {
          iVar1 = VP8GetBit((VP8BitReader *)CONCAT44(iVar4,iVar3),prob);
          if (iVar1 == 0) {
            in_stack_ffffffffffffffd0 = (uint32_t)CoeffsProba0[iVar4][iVar3][prob][local_28];
          }
          else {
            in_stack_ffffffffffffffd0 =
                 VP8GetValue((VP8BitReader *)
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                             in_stack_ffffffffffffffcc);
          }
          *(char *)(in_RSI + 0x4ab + (long)iVar4 * 0x108 + (long)iVar3 * 0x21 + (long)prob * 0xb +
                   (long)local_28) = (char)in_stack_ffffffffffffffd0;
          in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd0;
        }
      }
    }
    for (iVar3 = 0; iVar3 < 0x11; iVar3 = iVar3 + 1) {
      *(ulong *)(in_RSI + 0x8d0 + (long)iVar4 * 0x88 + (long)iVar3 * 8) =
           in_RSI + 0x4ab + (long)iVar4 * 0x108 + (ulong)""[iVar3] * 0x21;
    }
  }
  uVar2 = VP8GetValue((VP8BitReader *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffcc);
  *(uint32_t *)(in_RSI + 0xaf0) = uVar2;
  if (*(int *)(in_RSI + 0xaf0) != 0) {
    uVar2 = VP8GetValue((VP8BitReader *)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffcc);
    *(char *)(in_RSI + 0xaf4) = (char)uVar2;
  }
  return;
}

Assistant:

void VP8ParseProba(VP8BitReader* const br, VP8Decoder* const dec) {
  VP8Proba* const proba = &dec->proba_;
  int t, b, c, p;
  for (t = 0; t < NUM_TYPES; ++t) {
    for (b = 0; b < NUM_BANDS; ++b) {
      for (c = 0; c < NUM_CTX; ++c) {
        for (p = 0; p < NUM_PROBAS; ++p) {
          const int v =
              VP8GetBit(br, CoeffsUpdateProba[t][b][c][p], "global-header") ?
                        VP8GetValue(br, 8, "global-header") :
                        CoeffsProba0[t][b][c][p];
          proba->bands_[t][b].probas_[c][p] = v;
        }
      }
    }
    for (b = 0; b < 16 + 1; ++b) {
      proba->bands_ptr_[t][b] = &proba->bands_[t][kBands[b]];
    }
  }
  dec->use_skip_proba_ = VP8Get(br, "global-header");
  if (dec->use_skip_proba_) {
    dec->skip_p_ = VP8GetValue(br, 8, "global-header");
  }
}